

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O1

void __thiscall absl::lts_20250127::BadStatusOrAccess::~BadStatusOrAccess(BadStatusOrAccess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  StatusRep *this_00;
  
  *(undefined ***)this = &PTR__BadStatusOrAccess_01976540;
  pcVar2 = (this->what_)._M_dataplus._M_p;
  paVar1 = &(this->what_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (StatusRep *)(this->status_).rep_;
  if (((ulong)this_00 & 1) == 0) {
    status_internal::StatusRep::Unref(this_00);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~BadStatusOrAccess() override = default;